

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O0

s32 __thiscall irr::gui::CGUISpriteBank::addTextureAsSprite(CGUISpriteBank *this,ITexture *texture)

{
  u32 uVar1;
  dimension2d<unsigned_int> *pdVar2;
  ITexture *in_RSI;
  long *in_RDI;
  SGUISpriteFrame frame;
  SGUISprite sprite;
  u32 rectangleIndex;
  u32 textureIndex;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar3;
  SGUISprite *this_00;
  u32 in_stack_ffffffffffffffa0;
  u32 in_stack_ffffffffffffffa4;
  int local_4;
  
  if (in_RSI == (ITexture *)0x0) {
    local_4 = -1;
  }
  else {
    (**(code **)(*in_RDI + 0x20))(in_RDI,in_RSI);
    (**(code **)(*in_RDI + 0x10))();
    core::array<irr::core::rect<int>_>::size((array<irr::core::rect<int>_> *)0x3d413d);
    this_00 = (SGUISprite *)(in_RDI + 5);
    pdVar2 = video::ITexture::getOriginalSize(in_RSI);
    uVar3 = pdVar2->Width;
    video::ITexture::getOriginalSize(in_RSI);
    core::rect<int>::rect
              ((rect<int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)this_00 >> 0x20),(int)this_00);
    core::array<irr::core::rect<int>_>::push_back
              ((array<irr::core::rect<int>_> *)this_00,
               (rect<int> *)CONCAT44(uVar3,in_stack_ffffffffffffff88));
    SGUISprite::SGUISprite(this_00);
    SGUISpriteFrame::SGUISpriteFrame((SGUISpriteFrame *)&stack0xffffffffffffffa0);
    core::array<irr::gui::SGUISpriteFrame>::push_back
              (&this_00->Frames,(SGUISpriteFrame *)CONCAT44(uVar3,in_stack_ffffffffffffff88));
    core::array<irr::gui::SGUISprite>::push_back
              ((array<irr::gui::SGUISprite> *)this_00,
               (SGUISprite *)CONCAT44(uVar3,in_stack_ffffffffffffff88));
    uVar1 = core::array<irr::gui::SGUISprite>::size((array<irr::gui::SGUISprite> *)0x3d41ec);
    local_4 = uVar1 - 1;
    SGUISprite::~SGUISprite((SGUISprite *)0x3d41fd);
  }
  return local_4;
}

Assistant:

s32 CGUISpriteBank::addTextureAsSprite(video::ITexture *texture)
{
	if (!texture)
		return -1;

	addTexture(texture);
	u32 textureIndex = getTextureCount() - 1;

	u32 rectangleIndex = Rectangles.size();
	Rectangles.push_back(core::rect<s32>(0, 0, texture->getOriginalSize().Width, texture->getOriginalSize().Height));

	SGUISprite sprite;
	sprite.frameTime = 0;

	SGUISpriteFrame frame;
	frame.textureNumber = textureIndex;
	frame.rectNumber = rectangleIndex;
	sprite.Frames.push_back(frame);

	Sprites.push_back(sprite);

	return Sprites.size() - 1;
}